

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::isa_2b_to_sa(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
               *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  unsigned_long uVar1;
  unsigned_long uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  unsigned_long *puVar6;
  size_type __n;
  ulong uVar7;
  ulong uVar8;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> tuple_vec;
  allocator local_61;
  _Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_60;
  allocator_type local_48 [32];
  
  __n = (long)(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3;
  if (__n != this->local_size) {
    __assert_fail("local_B2.size() == local_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x339,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::isa_2b_to_sa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                 );
  }
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&local_60,__n
             ,local_48);
  uVar7 = this->local_size;
  uVar2 = (this->part).prefix;
  this_00 = &this->local_B;
  puVar3 = (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar4 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = &(local_60._M_impl.super__Vector_impl_data._M_start)->SA;
  uVar8 = 0;
  while( true ) {
    if (uVar7 <= uVar8) {
      if ((this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (this->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(this_00);
      puVar3 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(param_1);
      this_01 = &this->local_SA;
      puVar3 = (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar3) {
        (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_shrink_to_fit(this_01);
      std::__cxx11::string::string((string *)local_48,"isa2sa_tupleize",&local_61);
      std::__cxx11::string::~string((string *)local_48);
      mxx::impl::
      samplesort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>,false>
                (local_60._M_impl.super__Vector_impl_data._M_start,
                 local_60._M_impl.super__Vector_impl_data._M_finish,&this->comm);
      std::__cxx11::string::string((string *)local_48,"isa2sa_samplesort",&local_61);
      std::__cxx11::string::~string((string *)local_48);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,this->local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(param_1,this->local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,this->local_size);
      puVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = &(local_60._M_impl.super__Vector_impl_data._M_start)->SA;
      for (uVar7 = 0; uVar7 < this->local_size; uVar7 = uVar7 + 1) {
        puVar3[uVar7] = ((TwoBSA<unsigned_long> *)(puVar6 + -2))->B1;
        puVar4[uVar7] = puVar6[-1];
        puVar5[uVar7] = *puVar6;
        puVar6 = puVar6 + 3;
      }
      std::__cxx11::string::string((string *)local_48,"isa2sa_untupleize",&local_61);
      std::__cxx11::string::~string((string *)local_48);
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&local_60);
      return;
    }
    ((TwoBSA<unsigned_long> *)(puVar6 + -2))->B1 = puVar3[uVar8];
    puVar6[-1] = puVar4[uVar8];
    uVar1 = uVar2 + uVar8;
    if (uVar1 == 0xffffffffffffffff) break;
    *puVar6 = uVar1;
    uVar8 = uVar8 + 1;
    puVar6 = puVar6 + 3;
  }
  __assert_fail("str_offset + i < std::numeric_limits<index_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                ,0x349,
                "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned long, true>::isa_2b_to_sa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
               );
}

Assistant:

void isa_2b_to_sa(std::vector<index_t>& local_B2) {
    assert(local_B2.size() == local_size);
    SAC_TIMER_START();

    // convert the struct of arrays (local_SA, local_B, etc) into
    // array of structs (TwoBSA {.B1, .B2, .SA}) for sorting purposes

    // initialize tuple array
    std::vector<TwoBSA<index_t> > tuple_vec(local_size);

    // get global index offset
    std::size_t str_offset = part.excl_prefix_size();

    // fill tuple vector
    for (std::size_t i = 0; i < local_size; ++i) {
        tuple_vec[i].B1 = local_B[i];
        tuple_vec[i].B2 = local_B2[i];
        assert(str_offset + i < std::numeric_limits<index_t>::max());
        tuple_vec[i].SA = str_offset + i;
    }

    // release memory of input (to remain at the minimum 6x words memory usage)
    local_B.clear(); local_B.shrink_to_fit();
    local_B2.clear(); local_B2.shrink_to_fit();
    local_SA.clear(); local_SA.shrink_to_fit();

    SAC_TIMER_END_SECTION("isa2sa_tupleize");

    // parallel, distributed sample-sorting of tuples (B1, B2, SA)
    mxx::sort(tuple_vec.begin(), tuple_vec.end(), comm);

    SAC_TIMER_END_SECTION("isa2sa_samplesort");

    // reallocate output
    local_B.resize(local_size);
    local_B2.resize(local_size);
    local_SA.resize(local_size);

    // back convert array of structs into struct of arrays

    // read back into input vectors
    for (std::size_t i = 0; i < local_size; ++i) {
        local_B[i] = tuple_vec[i].B1;
        local_B2[i] = tuple_vec[i].B2;
        local_SA[i] = tuple_vec[i].SA;
    }
    SAC_TIMER_END_SECTION("isa2sa_untupleize");
}